

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funzip.cpp
# Opt level: O1

void __thiscall FUnzip::exec(FUnzip *this)

{
  char *pcVar1;
  pointer *__return_storage_ptr__;
  FILE **ppFVar2;
  string *__return_storage_ptr___00;
  ushort uVar3;
  pointer pcVar4;
  undefined4 m;
  undefined8 uVar5;
  undefined8 __stream;
  pointer ptVar6;
  uint32_t m_00;
  pointer piVar7;
  _func_int **__stream_00;
  int iVar8;
  id __tmp;
  time_t tVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  int *piVar12;
  Entry *e;
  pointer pEVar13;
  undefined1 auVar14 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__rhs_00;
  undefined1 auVar15 [8];
  undefined8 uStack_10258;
  char linkName [65536];
  mutex lm;
  undefined1 local_226 [8];
  LocalEntry le;
  ZipStream zs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [3];
  _Alloc_hider local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name_1;
  undefined1 local_138 [8];
  string dname;
  string fname;
  undefined1 local_f0 [8];
  vector<std::thread,_std::allocator<std::thread>_> workerThreads;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<int,_std::allocator<int>_> links;
  int *piStack_98;
  vector<int,_std::allocator<int>_> dirs;
  undefined4 local_74;
  ulong uStack_70;
  atomic<int> entryNum;
  int64_t uncompSize;
  undefined1 local_58 [8];
  File f;
  int local_38 [2];
  int uid;
  int gid;
  
  local_74 = 0;
  ZipStream::ZipStream((ZipStream *)&le.uncompSize,&this->zipName);
  if (zs.f_._vptr_File == (_func_int **)0x0) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar10 = &PTR__exception_001b1a08;
    puVar10[1] = "Not a zip file";
    __cxa_throw(puVar10,&funzip_exception::typeinfo,std::exception::~exception);
  }
  if (zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)le._22_8_) {
    pEVar13 = (pointer)le._22_8_;
    if (this->listFiles == true) {
      for (; pEVar13 !=
             zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
             _M_impl.super__Vector_impl_data._M_start; pEVar13 = pEVar13 + 1) {
        puts((pEVar13->name)._M_dataplus._M_p);
      }
    }
    else {
      f.fp_ = (FILE *)&this->destinationDir;
      iVar8 = std::__cxx11::string::compare((char *)f.fp_);
      if (iVar8 == 0) {
        smartDestDir(this,(ZipStream *)&le.uncompSize);
      }
      iVar8 = std::__cxx11::string::compare((char *)f.fp_);
      if ((iVar8 != 0) &&
         ((this->destinationDir)._M_dataplus._M_p[(this->destinationDir)._M_string_length - 1] !=
          '/')) {
        std::__cxx11::string::append((char *)f.fp_);
      }
      name.field_2._8_8_ = 0;
      dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      piStack_98 = (int *)0x0;
      dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      linkName[0xfff8] = '\0';
      linkName[0xfff9] = '\0';
      linkName[0xfffa] = '\0';
      linkName[0xfffb] = '\0';
      linkName[0xfffc] = '\0';
      linkName[0xfffd] = '\0';
      linkName[0xfffe] = '\0';
      linkName[0xffff] = '\0';
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_f0,
                 (long)this->threadCount,(allocator_type *)&uStack_10258);
      ptVar6 = workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar14 = local_f0;
      if (local_f0 !=
          (undefined1  [8])
          workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pcVar1 = linkName + 0x48;
        auVar15 = local_f0;
        do {
          uStack_10258 = &le.uncompSize;
          linkName._0_8_ = &local_74;
          linkName._8_8_ = linkName + 0xfff8;
          linkName._16_8_ = (long)&name.field_2 + 8;
          linkName._24_8_ = &piStack_98;
          linkName._32_8_ = &PTR__File_001b1870;
          linkName[0x28] = '\0';
          linkName[0x29] = '\0';
          linkName[0x2a] = '\0';
          linkName[0x2b] = '\0';
          linkName[0x2c] = '\0';
          linkName[0x2d] = '\0';
          linkName[0x2e] = '\0';
          linkName[0x2f] = '\0';
          linkName._40_8_ =
               fopen((char *)zs.comment_._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,"rb");
          linkName[0x30] = this->verbose;
          pcVar4 = (this->destinationDir)._M_dataplus._M_p;
          linkName._56_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(linkName + 0x38),pcVar4,
                     pcVar4 + (this->destinationDir)._M_string_length);
          local_178._M_p = (pointer)0x0;
          zs.f_.fp_ = (FILE *)operator_new(0x68);
          *(undefined ***)zs.f_.fp_ = &PTR___State_impl_001b1a30;
          *(undefined4 *)(zs.f_.fp_ + 8) = (undefined4)uStack_10258;
          *(undefined4 *)(zs.f_.fp_ + 0xc) = uStack_10258._4_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x10) = linkName._0_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x14) = linkName._4_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x18) = linkName._8_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x1c) = linkName._12_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x20) = linkName._16_4_;
          *(undefined4 *)(zs.f_.fp_ + 0x24) = linkName._20_4_;
          *(undefined8 *)(zs.f_.fp_ + 0x28) = linkName._24_8_;
          *(undefined ***)(zs.f_.fp_ + 0x30) = &PTR__File_001b1870;
          *(undefined8 *)(zs.f_.fp_ + 0x38) = 0;
          *(undefined8 *)(zs.f_.fp_ + 0x38) = linkName._40_8_;
          linkName[0x28] = '\0';
          linkName[0x29] = '\0';
          linkName[0x2a] = '\0';
          linkName[0x2b] = '\0';
          linkName[0x2c] = '\0';
          linkName[0x2d] = '\0';
          linkName[0x2e] = '\0';
          linkName[0x2f] = '\0';
          zs.f_.fp_[0x40] = (FILE)linkName[0x30];
          *(FILE **)(zs.f_.fp_ + 0x48) = zs.f_.fp_ + 0x58;
          if ((char *)linkName._56_8_ == pcVar1) {
            *(undefined4 *)(zs.f_.fp_ + 0x58) = linkName._72_4_;
            *(undefined4 *)(zs.f_.fp_ + 0x5c) = linkName._76_4_;
            *(undefined4 *)(zs.f_.fp_ + 0x60) = linkName._80_4_;
            *(undefined4 *)(zs.f_.fp_ + 100) = linkName._84_4_;
          }
          else {
            *(undefined8 *)(zs.f_.fp_ + 0x48) = linkName._56_8_;
            *(ulong *)(zs.f_.fp_ + 0x58) = CONCAT44(linkName._76_4_,linkName._72_4_);
          }
          *(undefined8 *)(zs.f_.fp_ + 0x50) = linkName._64_8_;
          linkName[0x40] = '\0';
          linkName[0x41] = '\0';
          linkName[0x42] = '\0';
          linkName[0x43] = '\0';
          linkName[0x44] = '\0';
          linkName[0x45] = '\0';
          linkName[0x46] = '\0';
          linkName[0x47] = '\0';
          linkName._72_4_ = linkName._72_4_ & 0xffffff00;
          linkName._56_8_ = pcVar1;
          std::thread::_M_start_thread(&stack0xfffffffffffffe88,&zs.f_.fp_,0);
          if (zs.f_.fp_ != (FILE *)0x0) {
            (**(code **)(*(long *)zs.f_.fp_ + 8))();
          }
          pcVar4 = (pointer)(((pointer)auVar15)->_M_id)._M_thread;
          if (pcVar4 != (pointer)0x0) {
            std::terminate();
          }
          (((pointer)auVar15)->_M_id)._M_thread = (native_handle_type)local_178._M_p;
          local_178._M_p = pcVar4;
          if ((char *)linkName._56_8_ != pcVar1) {
            operator_delete((void *)linkName._56_8_,CONCAT44(linkName._76_4_,linkName._72_4_) + 1);
          }
          linkName._32_8_ = &PTR__File_001b1870;
          if (linkName._40_8_ != 0) {
            fclose((FILE *)linkName._40_8_);
          }
          auVar15 = (undefined1  [8])((long)auVar15 + 8);
          auVar14 = local_f0;
        } while (auVar15 != (undefined1  [8])ptVar6);
      }
      for (; auVar14 !=
             (undefined1  [8])
             workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start; auVar14 = (undefined1  [8])((long)auVar14 + 8)) {
        std::thread::join();
      }
      local_58 = (undefined1  [8])&PTR__File_001b1870;
      f._vptr_File = (_func_int **)0x0;
      f._vptr_File = (_func_int **)
                     fopen((char *)zs.comment_._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl,"rb");
      if (name.field_2._8_8_ != 0) {
        __return_storage_ptr__ =
             &workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        ppFVar2 = &zs.f_.fp_;
        uVar11 = name.field_2._8_8_;
        fname.field_2._8_8_ = f._vptr_File;
        do {
          __stream = fname.field_2._8_8_;
          uVar5 = le._22_8_;
          iVar8 = *(int *)uVar11;
          fseek((FILE *)fname.field_2._8_8_,*(long *)(le._22_8_ + 0x20 + (long)iVar8 * 0x38),0);
          fread(local_226,1,0x1e,(FILE *)__stream);
          fseek((FILE *)__stream,(ulong)(ushort)le.compSize,1);
          local_38[1] = 0xffffffff;
          local_38[0] = -1;
          uStack_70 = (ulong)le.crc;
          readExtra((File *)local_58,(uint)le.compSize._2_2_,local_38,local_38 + 1,(int64_t *)0x0,
                    (int64_t *)&stack0xffffffffffffff90);
          __rhs_00 = (string *)(uVar5 + (long)iVar8 * 0x38);
          fread(&uStack_10258,1,uStack_70,(FILE *)__stream);
          linkName[uStack_70 - 8] = '\0';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)f.fp_,
                         __rhs_00);
          path_directory((string *)local_138,(string *)__return_storage_ptr__);
          __return_storage_ptr___00 = (string *)((long)&dname.field_2 + 8);
          path_filename(__return_storage_ptr___00,__rhs_00);
          if (this->verbose == true) {
            printf("Link %s/%s -> %s\n",local_138,dname.field_2._8_8_,&uStack_10258);
          }
          std::experimental::filesystem::v1::__cxx11::path::
          path<char[65536],std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)ppFVar2,(char (*) [65536])&uStack_10258);
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)&stack0xfffffffffffffe88,__return_storage_ptr___00);
          std::experimental::filesystem::v1::create_symlink
                    ((path *)ppFVar2,(path *)&stack0xfffffffffffffe88);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)&stack0xfffffffffffffe88);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)ppFVar2);
          m = le._2_4_;
          uVar3 = (ushort)__rhs_00[1]._M_string_length;
          if (uVar3 != 0) {
            std::experimental::filesystem::v1::__cxx11::path::
            path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                      ((path *)ppFVar2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__);
            std::experimental::filesystem::v1::permissions((path *)ppFVar2,(uint)uVar3);
            std::experimental::filesystem::v1::__cxx11::path::~path((path *)ppFVar2);
          }
          tVar9 = msdosToUnixTime(m);
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)ppFVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__);
          std::experimental::filesystem::v1::last_write_time(ppFVar2,tVar9 * 1000000000);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)ppFVar2);
          if ((size_type *)dname.field_2._8_8_ != &fname._M_string_length) {
            operator_delete((void *)dname.field_2._8_8_,fname._M_string_length + 1);
          }
          if (local_138 != (undefined1  [8])&dname._M_string_length) {
            operator_delete((void *)local_138,dname._M_string_length + 1);
          }
          if (workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)&name._M_string_length) {
            operator_delete(workerThreads.
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,name._M_string_length + 1);
          }
          uVar11 = uVar11 + 4;
        } while ((int *)uVar11 != (int *)0x0);
      }
      __stream_00 = f._vptr_File;
      piVar7 = dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (piStack_98 !=
          dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        ppFVar2 = &zs.f_.fp_;
        piVar12 = piStack_98;
        do {
          uVar11 = le._22_8_;
          iVar8 = *piVar12;
          fseek((FILE *)__stream_00,*(long *)(le._22_8_ + 0x20 + (long)iVar8 * 0x38),0);
          fread(&workerThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,1,0x1e,(FILE *)__stream_00);
          fseek((FILE *)__stream_00,(ulong)(ushort)name.field_2._M_allocated_capacity._2_2_,1);
          local_38[1] = 0xffffffff;
          local_38[0] = -1;
          readExtra((File *)local_58,(uint)(ushort)name.field_2._M_allocated_capacity._4_2_,local_38
                    ,local_38 + 1,(int64_t *)0x0,(int64_t *)0x0);
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (uVar11 + (long)iVar8 * 0x38);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffe88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)f.fp_,
                         __rhs);
          if ((local_178._M_p + -1)[(long)name_1._M_dataplus._M_p] == '/') {
            std::__cxx11::string::substr((ulong)ppFVar2,(ulong)&stack0xfffffffffffffe88);
            std::__cxx11::string::operator=((string *)&stack0xfffffffffffffe88,(string *)ppFVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)zs.f_.fp_ != local_1a8) {
              operator_delete(zs.f_.fp_,local_1a8[0]._M_allocated_capacity + 1);
            }
          }
          m_00 = name._M_dataplus._M_p._2_4_;
          uVar3 = (ushort)__rhs[1]._M_string_length;
          if (uVar3 != 0) {
            std::experimental::filesystem::v1::__cxx11::path::
            path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                      ((path *)ppFVar2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffe88);
            std::experimental::filesystem::v1::permissions((path *)ppFVar2,(uint)uVar3);
            std::experimental::filesystem::v1::__cxx11::path::~path((path *)ppFVar2);
          }
          tVar9 = msdosToUnixTime(m_00);
          std::experimental::filesystem::v1::__cxx11::path::
          path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                    ((path *)ppFVar2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe88);
          std::experimental::filesystem::v1::last_write_time(ppFVar2,tVar9 * 1000000000);
          std::experimental::filesystem::v1::__cxx11::path::~path((path *)ppFVar2);
          if ((size_type *)local_178._M_p != &name_1._M_string_length) {
            operator_delete(local_178._M_p,name_1._M_string_length + 1);
          }
          piVar12 = piVar12 + 1;
        } while (piVar12 != piVar7);
      }
      if (zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        puts((char *)zs.entries_.
                     super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
      }
      local_58 = (undefined1  [8])&PTR__File_001b1870;
      if (f._vptr_File != (_func_int **)0x0) {
        fclose((FILE *)f._vptr_File);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_f0);
      if (piStack_98 != (int *)0x0) {
        operator_delete(piStack_98,
                        (long)dirs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piStack_98);
      }
      if (name.field_2._8_8_ != 0) {
        operator_delete((void *)name.field_2._8_8_,-name.field_2._8_8_);
      }
    }
  }
  zs.zipName_.field_2._8_8_ = &PTR__File_001b1870;
  if (zs.f_._vptr_File != (_func_int **)0x0) {
    fclose((FILE *)zs.f_._vptr_File);
  }
  zs.f_._vptr_File = (_func_int **)0x0;
  if (zs.comment_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl !=
      (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)&zs.zipName_._M_string_length)
  {
    operator_delete((void *)zs.comment_._M_t.
                            super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                            super__Head_base<0UL,_char_*,_false>._M_head_impl,
                    zs.zipName_._M_string_length + 1);
  }
  if (zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete__(zs.entries_.
                      super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  zs.entries_.super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::~vector
            ((vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_> *)&le.uncompSize);
  return;
}

Assistant:

void FUnzip::exec()
{
    std::atomic<int> entryNum(0);
    ZipStream zs{zipName};
    if (!zs.valid())
        throw funzip_exception("Not a zip file");

    if (zs.size() == 0)
        return;

    if (listFiles) {
        for (auto const& e : zs) {
            printf("%s\n", e.name.c_str());
        }
        return;
    }

    if (destinationDir == "")
        smartDestDir(zs);
    if (destinationDir != "" &&
        destinationDir[destinationDir.size() - 1] != '/')
        destinationDir += "/";

    std::vector<int> links;
    std::vector<int> dirs;
    std::mutex lm;

    std::vector<std::thread> workerThreads(threadCount);

    for (auto& t : workerThreads) {
        t = std::thread([&zs, &entryNum, &lm, &links, &dirs, f = zs.dupFile(),
                         verbose = verbose,
                         destDir = destinationDir]() mutable {
            while (true) {
                unsigned en = entryNum++;
                if (en >= zs.size())
                    break;
                auto& e = zs.getEntry(en);
                if ((e.flags & S_IFLNK) == S_IFLNK) {
                    std::lock_guard<std::mutex> lock(lm);
                    links.push_back(en);
                    continue;
                }

                if ((e.flags & S_IFDIR) == S_IFDIR ||
                    e.name[e.name.length() - 1] == '/') {
                    std::lock_guard<std::mutex> lock(lm);
                    dirs.push_back(en);
                    if (!fileExists(e.name))
                        makedirs(e.name);
                    continue;
                }

                f.seek(e.offset);
                auto le = f.Read<LocalEntry>();

                f.seek(le.nameLen, SEEK_CUR);
                int gid = -1;
                int uid = -1;
                int64_t uncompSize = le.uncompSize;
                int64_t compSize = le.compSize;
                // Read extra fields
                readExtra(f, le.exLen, &uid, &gid, &compSize, &uncompSize);
                auto name = destDir + e.name;
                auto dname = path_directory(name);
                if (dname != "" && !fileExists(dname))
                    makedirs(dname);

                if (verbose) {
                    printf("%s\n", name.c_str());
                    fflush(stdout);
                }
                // printf("%s %x %s %s\n", fileName, a, (a & S_IFDIR)  ==
                // S_IFDIR ? "DIR" : "", (a & S_IFLNK) == S_IFLNK ? "LINK" :
                // "");

                auto fout = File{name, File::Mode::WRITE};
                if (!fout.canWrite()) {
                    // char errstr[128];
                    // strerror_r(errno, errstr, sizeof(errstr));
                    // fprintf(stderr, "**Warning: Could not write '%s' (%s)\n",
                    // name.c_str(), errstr);
                    continue;
                }
                if (le.method == 0)
                    copyfile(fout, uncompSize, f);
                else
                    uncompress(fout, compSize, f);
                fout.close();
                setMeta(name, e.flags, le.dateTime, uid, gid);
            }
        });
    }
    for (auto& t : workerThreads)
        t.join();

    char linkName[65536];
    int uid, gid;
    auto f = zs.dupFile();
    for (int i : links) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        int64_t uncompSize = le.uncompSize;
        readExtra(f, le.exLen, &uid, &gid, nullptr, &uncompSize);
        f.Read(linkName, uncompSize);
        linkName[uncompSize] = 0;
        auto name = destinationDir + e.name;
        auto dname = path_directory(name);
        auto fname = path_filename(e.name);
        // int fd = open(dname.c_str(), 0);
        if (verbose)
            printf("Link %s/%s -> %s\n", dname.c_str(), fname.c_str(),
                   linkName);
        fs::create_symlink(linkName, fname);
        // symlinkat(linkName, fd, fname.c_str());
        // close(fd);
        setMeta(name, e.flags, le.dateTime, uid, gid, true);
    }
    for (int i : dirs) {
        auto& e = zs.getEntry(i);
        f.seek(e.offset);
        auto le = f.Read<LocalEntry>();

        f.seek(le.nameLen, SEEK_CUR);
        uid = gid = -1;
        readExtra(f, le.exLen, &uid, &gid);
        auto name = destinationDir + e.name;
        auto l = name.length();
        if (name[l - 1] == '/')
            name = name.substr(0, l - 1);
        setMeta(name, e.flags, le.dateTime, uid, gid);
    }

    if (zs.comment())
        puts(zs.comment());
}